

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O0

void VP8YuvToRgba32_SSE2(uint8_t *y,uint8_t *u,uint8_t *v,uint8_t *dst)

{
  uint8_t *in_RCX;
  __m128i B;
  __m128i G;
  __m128i R;
  int n;
  __m128i kAlpha;
  longlong local_a8 [2];
  longlong local_98 [2];
  __m128i *in_stack_ffffffffffffff78;
  __m128i *in_stack_ffffffffffffff80;
  __m128i *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int iVar1;
  uint8_t *u_00;
  uint8_t *y_00;
  uint8_t *local_50;
  
  u_00 = (uint8_t *)0xff00ff00ff00ff;
  y_00 = (uint8_t *)0xff00ff00ff00ff;
  local_50 = in_RCX;
  for (iVar1 = 0; iVar1 < 0x20; iVar1 = iVar1 + 8) {
    YUV444ToRGB_SSE2(y_00,u_00,(uint8_t *)CONCAT44(iVar1,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    PackAndStore4_SSE2((__m128i *)&stack0xffffffffffffff78,&local_98,&local_a8,
                       (__m128i *)&stack0xffffffffffffff98,local_50);
    local_50 = local_50 + 0x20;
  }
  return;
}

Assistant:

void VP8YuvToRgba32_SSE2(const uint8_t* WEBP_RESTRICT y,
                         const uint8_t* WEBP_RESTRICT u,
                         const uint8_t* WEBP_RESTRICT v,
                         uint8_t* WEBP_RESTRICT dst) {
  const __m128i kAlpha = _mm_set1_epi16(255);
  int n;
  for (n = 0; n < 32; n += 8, dst += 32) {
    __m128i R, G, B;
    YUV444ToRGB_SSE2(y + n, u + n, v + n, &R, &G, &B);
    PackAndStore4_SSE2(&R, &G, &B, &kAlpha, dst);
  }
}